

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::appendAnchor
          (btSoftBody *this,int node,btRigidBody *body,bool disableCollisionBetweenLinkedBodies,
          btScalar influence)

{
  byte in_CL;
  btCollisionObject *in_RDX;
  int in_ESI;
  long in_RDI;
  btScalar unaff_retaddr;
  undefined1 unaff_retaddr_00;
  btVector3 *in_stack_00000008;
  btRigidBody *in_stack_00000010;
  int in_stack_0000001c;
  btSoftBody *in_stack_00000020;
  btVector3 local;
  btVector3 *in_stack_ffffffffffffff78;
  btTransform *this_00;
  btTransform local_70;
  btScalar local_30 [4];
  byte local_19;
  
  local_19 = in_CL & 1;
  btCollisionObject::getWorldTransform(in_RDX);
  this_00 = &local_70;
  btTransform::inverse((btTransform *)in_RDX);
  btAlignedObjectArray<btSoftBody::Node>::operator[]
            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_ESI);
  local_30 = (btScalar  [4])btTransform::operator*(this_00,in_stack_ffffffffffffff78);
  appendAnchor(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
               (bool)unaff_retaddr_00,unaff_retaddr);
  return;
}

Assistant:

void			btSoftBody::appendAnchor(int node,btRigidBody* body, bool disableCollisionBetweenLinkedBodies,btScalar influence)
{
	btVector3 local = body->getWorldTransform().inverse()*m_nodes[node].m_x;
	appendAnchor(node,body,local,disableCollisionBetweenLinkedBodies,influence);
}